

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void parse(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
          cio_read_buffer *read_buffer,size_t bytes_to_parse)

{
  _Bool _Var1;
  cio_error cVar2;
  uint8_t *data;
  cio_http_client *num;
  cio_http_client *local_58;
  size_t nparsed;
  size_t available;
  http_parser *parser;
  cio_http_client *client;
  size_t bytes_to_parse_local;
  cio_read_buffer *read_buffer_local;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  _Var1 = cio_is_error(err);
  if (_Var1) {
    handle_server_error((cio_http_client *)handler_context,"Reading from buffered stream failed!");
  }
  else {
    client = (cio_http_client *)bytes_to_parse;
    if (err == CIO_EOF) {
      client = (cio_http_client *)0x0;
    }
    if (*(long *)((long)handler_context + 0x310) != 0) {
      local_58 = (cio_http_client *)cio_read_buffer_unread_bytes(read_buffer);
      if (*(cio_http_client **)((long)handler_context + 0x310) <= local_58) {
        local_58 = *(cio_http_client **)((long)handler_context + 0x310);
      }
      client = local_58;
      *(long *)((long)handler_context + 0x310) =
           *(long *)((long)handler_context + 0x310) - (long)local_58;
    }
    *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + 1;
    data = cio_read_buffer_get_read_ptr(read_buffer);
    num = (cio_http_client *)
          http_parser_execute((http_parser *)((long)handler_context + 0x358),
                              (http_parser_settings *)((long)handler_context + 0x378),(char *)data,
                              (size_t)client);
    cio_read_buffer_consume(read_buffer,(size_t)num);
    *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + -1;
    if (err == CIO_EOF) {
      close_client((cio_http_client *)handler_context);
    }
    else if (num == client) {
      if ((*(byte *)((long)handler_context + 0x31b) & 1) == 0) {
        if (-1 < *(int *)((long)handler_context + 0x36c)) {
          (**(code **)((long)handler_context + 0x328))(handler_context);
        }
      }
      else {
        close_client((cio_http_client *)handler_context);
      }
    }
    else {
      cVar2 = write_response((cio_http_client *)handler_context,CIO_HTTP_STATUS_BAD_REQUEST,
                             (cio_write_buffer *)0x0,(cio_response_written_cb_t)0x0);
      if (cVar2 != CIO_SUCCESS) {
        close_client((cio_http_client *)handler_context);
      }
    }
  }
  return;
}

Assistant:

static void parse(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t bytes_to_parse)
{
	(void)buffered_stream;

	struct cio_http_client *client = (struct cio_http_client *)handler_context;
	http_parser *parser = &client->parser;

	if (cio_unlikely(cio_is_error(err))) {
		handle_server_error(client, "Reading from buffered stream failed!");
		return;
	}

	if (err == CIO_EOF) {
		bytes_to_parse = 0;
	}

	if (client->http_private.remaining_content_length > 0) {
		size_t available = cio_read_buffer_unread_bytes(read_buffer);
		bytes_to_parse = CIO_MIN(available, client->http_private.remaining_content_length);
		client->http_private.remaining_content_length -= bytes_to_parse;
	}

	client->http_private.parsing++;

	size_t nparsed = http_parser_execute(parser, &client->parser_settings, (const char *)cio_read_buffer_get_read_ptr(read_buffer), bytes_to_parse);
	cio_read_buffer_consume(read_buffer, nparsed);
	client->http_private.parsing--;

	if (err == CIO_EOF) {
		close_client(client);
		return;
	}

	if (cio_unlikely(nparsed != bytes_to_parse)) {
		err = write_response(client, CIO_HTTP_STATUS_BAD_REQUEST, NULL, NULL);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			close_client(client);
		}

		return;
	}

	if (client->http_private.to_be_closed) {
		close_client(client);
		return;
	}

	if (parser->upgrade) {
		return;
	}

	client->http_private.finish_func(client);
}